

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O2

void __thiscall ThreadedReplayer::tear_down_threads(ThreadedReplayer *this)

{
  pointer ptVar1;
  thread *thread;
  pointer ptVar2;
  
  std::mutex::lock(&this->pipeline_work_queue_mutex);
  this->shutting_down = true;
  std::condition_variable::notify_all();
  pthread_mutex_unlock((pthread_mutex_t *)&this->pipeline_work_queue_mutex);
  ptVar1 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
           .super__Vector_impl_data._M_finish;
  for (ptVar2 = (this->thread_pool).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                _M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    if ((ptVar2->_M_id)._M_thread != 0) {
      std::thread::join();
    }
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::clear(&this->thread_pool);
  return;
}

Assistant:

void tear_down_threads()
	{
		// Signal that it's time for threads to die.
		{
			lock_guard<mutex> lock(pipeline_work_queue_mutex);
			shutting_down = true;
			work_available_condition.notify_all();
		}

		for (auto &thread : thread_pool)
			if (thread.joinable())
				thread.join();
		thread_pool.clear();
	}